

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevcStreamReader.cpp
# Opt level: O3

int __thiscall
HEVCStreamReader::getTSDescriptor
          (HEVCStreamReader *this,uint8_t *dstBuff,bool blurayMode,bool hdmvDescriptors)

{
  byte bVar1;
  HevcSpsUnit *pHVar2;
  undefined1 *puVar3;
  int iVar4;
  int iVar5;
  byte *buffer;
  ulong uVar6;
  uint height;
  undefined7 in_register_00000011;
  uint width;
  ulong uVar7;
  uint8_t *puVar8;
  uint8_t aspect_ratio_index;
  uint8_t frame_rate_index;
  CheckStreamRez rez;
  uint8_t local_246;
  byte local_245;
  undefined4 local_244;
  undefined8 local_240;
  CheckStreamRez local_238 [3];
  
  if (this->m_firstFrame == true) {
    puVar8 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_buffer;
    checkStream(local_238,this,puVar8,
                *(int *)&(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd -
                (int)puVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0].lang._M_dataplus._M_p != &local_238[0].lang.field_2) {
      operator_delete(local_238[0].lang._M_dataplus._M_p,
                      local_238[0].lang.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0].streamDescr._M_dataplus._M_p != &local_238[0].streamDescr.field_2) {
      operator_delete(local_238[0].streamDescr._M_dataplus._M_p,
                      local_238[0].streamDescr.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0].codecInfo.programName._M_dataplus._M_p !=
        &local_238[0].codecInfo.programName.field_2) {
      operator_delete(local_238[0].codecInfo.programName._M_dataplus._M_p,
                      local_238[0].codecInfo.programName.field_2._M_allocated_capacity + 1);
    }
    puVar3 = (undefined1 *)
             CONCAT17(local_238[0].codecInfo.displayName._M_dataplus._M_p._7_1_,
                      CONCAT43(local_238[0].codecInfo.displayName._M_dataplus._M_p._3_4_,
                               local_238[0].codecInfo.displayName._M_dataplus._M_p._0_3_));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar3 != &local_238[0].codecInfo.displayName.field_2) {
      operator_delete(puVar3,local_238[0].codecInfo.displayName.field_2._M_allocated_capacity + 1);
    }
  }
  local_240 = 0;
  if ((!blurayMode) && (this->m_hdr->isDVRPU == true)) {
    builtin_memcpy(dstBuff,"\x05\x04DOVI",6);
    dstBuff = dstBuff + 6;
    local_240 = 6;
  }
  if (hdmvDescriptors) {
    dstBuff[0] = '\x05';
    dstBuff[1] = '\b';
    dstBuff[2] = 'H';
    dstBuff[3] = 'D';
    dstBuff[4] = 'M';
    dstBuff[5] = 'V';
    dstBuff[6] = 0xff;
    dstBuff[7] = '$';
    pHVar2 = this->m_sps;
    local_244 = (undefined4)CONCAT71(in_register_00000011,blurayMode);
    if (pHVar2 == (HevcSpsUnit *)0x0) {
      width = 0;
      height = 0;
    }
    else {
      width = pHVar2->pic_width_in_luma_samples;
      height = pHVar2->pic_height_in_luma_samples;
    }
    M2TSStreamInfo::blurayStreamParams
              ((this->super_MPEGStreamReader).m_fps,false,width,height,
               (this->super_MPEGStreamReader).m_streamAR,(uint8_t *)local_238,&local_245,&local_246)
    ;
    dstBuff[8] = (char)local_238[0].codecInfo.codecID << 4 | local_245;
    dstBuff[9] = local_246 << 4 | 0xf;
    puVar8 = dstBuff + 10;
    blurayMode = SUB41(local_244,0);
  }
  else {
    buffer = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_buffer;
    puVar8 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
    while( true ) {
      buffer = NALUnit::findNextNAL(buffer,puVar8);
      puVar8 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
      if (puVar8 + -4 <= buffer) break;
      bVar1 = *buffer;
      puVar8 = NALUnit::findNALWithStartCode(buffer,puVar8,true);
      if ((bVar1 & 0x7e) == 0x42) {
        uVar6 = (ulong)(uint)((int)puVar8 - (int)buffer);
        uVar7 = 0x1f8;
        if (uVar6 < 0x1f8) {
          uVar7 = uVar6;
        }
        NALUnit::decodeNAL(buffer,buffer + uVar7,(uint8_t *)local_238,0x200);
        break;
      }
      puVar8 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
    }
    dstBuff[0] = '8';
    dstBuff[1] = '\r';
    *(ulong *)(dstBuff + 2) =
         CONCAT35(local_238[0].codecInfo.displayName._M_dataplus._M_p._0_3_,
                  local_238[0].codecInfo._3_5_);
    *(undefined4 *)(dstBuff + 10) = local_238[0].codecInfo.displayName._M_dataplus._M_p._3_4_;
    dstBuff[0xe] = (this->m_sps->sub_pic_hrd_params_present_flag ^ 1U) << 4 | 0xf;
    puVar8 = dstBuff + 0xf;
  }
  iVar5 = (int)local_240;
  if ((blurayMode == false) && (this->m_hdr->isDVRPU == true)) {
    iVar4 = setDoViDescriptor(this,puVar8);
    iVar5 = iVar4 + iVar5;
  }
  return (uint)!hdmvDescriptors + (uint)!hdmvDescriptors * 4 + iVar5 + 10;
}

Assistant:

int HEVCStreamReader::getTSDescriptor(uint8_t* dstBuff, const bool blurayMode, const bool hdmvDescriptors)
{
    if (m_firstFrame)
        CheckStreamRez rez = checkStream(m_buffer, static_cast<int>(m_bufEnd - m_buffer));

    int lenDoviDesc = 0;
    if (!blurayMode && m_hdr->isDVRPU)
    {
        // 'DOVI' registration descriptor
        *dstBuff++ = static_cast<uint8_t>(TSDescriptorTag::REGISTRATION);
        *dstBuff++ = 4;  // descriptor length
        *dstBuff++ = 'D';
        *dstBuff++ = 'O';
        *dstBuff++ = 'V';
        *dstBuff++ = 'I';
        lenDoviDesc += 6;
    }

    if (hdmvDescriptors)
    {
        // 'HDMV' registration descriptor
        *dstBuff++ = static_cast<uint8_t>(TSDescriptorTag::HDMV);  // descriptor tag
        *dstBuff++ = 8;                                            // descriptor length
        *dstBuff++ = 'H';
        *dstBuff++ = 'D';
        *dstBuff++ = 'M';
        *dstBuff++ = 'V';
        *dstBuff++ = 0xff;  // stuffing byte

        *dstBuff++ = static_cast<uint8_t>(StreamType::VIDEO_H265);  // stream_conding_type
        uint8_t video_format, frame_rate_index, aspect_ratio_index;
        M2TSStreamInfo::blurayStreamParams(getFPS(), getInterlaced(), getStreamWidth(), getStreamHeight(),
                                           getStreamAR(), &video_format, &frame_rate_index, &aspect_ratio_index);

        *dstBuff++ = static_cast<uint8_t>(video_format << 4 | frame_rate_index);
        *dstBuff++ = static_cast<uint8_t>(aspect_ratio_index << 4 | 0xf);
    }
    else
    {
        uint8_t tmpBuffer[512];

        for (uint8_t* nal = NALUnit::findNextNAL(m_buffer, m_bufEnd); nal < m_bufEnd - 4;
             nal = NALUnit::findNextNAL(nal, m_bufEnd))
        {
            const auto nalType = static_cast<HevcUnit::NalType>((*nal >> 1) & 0x3f);
            const uint8_t* nextNal = NALUnit::findNALWithStartCode(nal, m_bufEnd, true);

            if (nalType == HevcUnit::NalType::SPS)
            {
                const int toDecode = FFMIN(sizeof(tmpBuffer) - 8, (unsigned)(nextNal - nal));
                NALUnit::decodeNAL(nal, nal + toDecode, tmpBuffer, sizeof(tmpBuffer));
                break;
            }
        }

        *dstBuff++ = static_cast<int>(TSDescriptorTag::HEVC);
        *dstBuff++ = 13;  // descriptor length
        memcpy(dstBuff, tmpBuffer + 3, 12);
        dstBuff += 12;
        // flags temporal_layer_subset, HEVC_still_present,
        // HEVC_24hr_picture_present, HDR_WCG unspecified
        *dstBuff++ = m_sps->sub_pic_hrd_params_present_flag ? 0x0f : 0x1f;

        /* HEVC_timing_and_HRD_descriptor
        // mandatory for interlaced video only
        memcpy(dstBuff, "\x3f\x0f\x03\x7f\x7f", 5);
        dstBuff += 5;

        uint32_t N = 1001 * getFPS();
        uint32_t K = 27000000;
        uint32_t num_units_in_tick = 1001;
        if (N % 1000)
        {
            N = 1000 * getFPS();
            num_units_in_tick = 1000;
        }
        N = my_htonl(N);
        K = my_htonl(K);
        num_units_in_tick = my_htonl(num_units_in_tick);
        memcpy(dstBuff, &N, 4);
        dstBuff += 4;
        memcpy(dstBuff, &K, 4);
        dstBuff += 4;
        memcpy(dstBuff, &num_units_in_tick, 4);
        dstBuff += 4;
        */
    }

    if (!blurayMode && m_hdr->isDVRPU)
        lenDoviDesc += setDoViDescriptor(dstBuff);

    return (hdmvDescriptors ? 10 : 15) + lenDoviDesc;
}